

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

vector<YAML::Node,_std::allocator<YAML::Node>_> *
YAML::LoadAllFromFile
          (vector<YAML::Node,_std::allocator<YAML::Node>_> *__return_storage_ptr__,string *filename)

{
  BadFile *this;
  ifstream fin;
  byte abStack_200 [488];
  
  std::ifstream::ifstream(&fin,(string *)filename,_S_in);
  if ((abStack_200[*(long *)(_fin + -0x18)] & 5) == 0) {
    LoadAll(__return_storage_ptr__,(istream *)&fin);
    std::ifstream::~ifstream(&fin);
    return __return_storage_ptr__;
  }
  this = (BadFile *)__cxa_allocate_exception(0x40);
  BadFile::BadFile(this,filename);
  __cxa_throw(this,&BadFile::typeinfo,BadConversion::~BadConversion);
}

Assistant:

std::vector<Node> LoadAllFromFile(const std::string& filename) {
  std::ifstream fin(filename);
  if (!fin) {
    throw BadFile(filename);
  }
  return LoadAll(fin);
}